

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O3

string * __thiscall
duckdb::BoundOrderByNode::ToString_abi_cxx11_(string *__return_storage_ptr__,BoundOrderByNode *this)

{
  pointer pEVar1;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->expression);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[8])(__return_storage_ptr__,pEVar1);
  if ((this->type == DESCENDING) || (this->type == ASCENDING)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->null_order == NULLS_FIRST) || (this->null_order == NULLS_LAST)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundOrderByNode::ToString() const {
	auto str = expression->ToString();
	switch (type) {
	case OrderType::ASCENDING:
		str += " ASC";
		break;
	case OrderType::DESCENDING:
		str += " DESC";
		break;
	default:
		break;
	}

	switch (null_order) {
	case OrderByNullType::NULLS_FIRST:
		str += " NULLS FIRST";
		break;
	case OrderByNullType::NULLS_LAST:
		str += " NULLS LAST";
		break;
	default:
		break;
	}
	return str;
}